

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O3

Vec_Ptr_t * Gia_GetFakeNames(int nNames)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  undefined1 *puVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < nNames - 1U) {
    uVar7 = (ulong)(uint)nNames;
  }
  pVVar2->nSize = 0;
  iVar6 = (int)uVar7;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar2->pArray = ppvVar3;
  if (0 < nNames) {
    uVar8 = 0;
    do {
      uVar1 = uStack_38;
      if ((uint)nNames < 0x1a) {
        uStack_38._0_4_ = CONCAT13((char)uVar8 + 'a',(undefined3)uStack_38);
        puVar4 = (undefined1 *)((long)&uStack_38 + 4);
      }
      else {
        uStack_38._0_4_ =
             CONCAT13((0x60U - ((char)((uVar8 & 0xffffffff) / 0x1a) * '\x19' +
                               (char)((uVar8 & 0xffffffff) / 0x1a)) | 1) + (char)uVar8,
                      (undefined3)uStack_38);
        uStack_38._5_3_ = SUB83(uVar1,5);
        uStack_38._0_5_ = CONCAT14((char)((uVar8 & 0xffffffff) / 0x1a) + '0',(undefined4)uStack_38);
        puVar4 = (undefined1 *)((long)&uStack_38 + 5);
      }
      *puVar4 = 0;
      pcVar5 = Extra_UtilStrsav((char *)((long)&uStack_38 + 3));
      iVar6 = (int)uVar7;
      if ((int)uVar8 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar7 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      iVar6 = (int)(uVar8 + 1);
      pVVar2->nSize = iVar6;
      ppvVar3[uVar8] = pcVar5;
      uVar8 = uVar8 + 1;
    } while (nNames != iVar6);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Gia_GetFakeNames( int nNames )
{
    Vec_Ptr_t * vNames;
    char Buffer[5];
    int i;

    vNames = Vec_PtrAlloc( nNames );
    for ( i = 0; i < nNames; i++ )
    {
        if ( nNames < 26 )
        {
            Buffer[0] = 'a' + i;
            Buffer[1] = 0;
        }
        else
        {
            Buffer[0] = 'a' + i%26;
            Buffer[1] = '0' + i/26;
            Buffer[2] = 0;
        }
        Vec_PtrPush( vNames, Extra_UtilStrsav(Buffer) );
    }
    return vNames;
}